

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::dumpArgument
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_int arg_index,size_t size,
          void *pBuffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t size_00;
  int iVar3;
  long lVar4;
  mapped_type *__k;
  iterator iVar5;
  undefined8 uVar6;
  mapped_type *pmVar7;
  char *unaff_R12;
  string fileName;
  char enqueueCount [256];
  string local_190;
  CLIntercept *local_170;
  uint local_164;
  pthread_mutex_t *local_160;
  void *local_158;
  size_t local_150;
  uint64_t local_148;
  cl_kernel local_140;
  string local_138 [8];
  
  if (kernel != (cl_kernel)0x0) {
    local_160 = (pthread_mutex_t *)&this->m_Mutex;
    local_158 = pBuffer;
    iVar3 = pthread_mutex_lock(local_160);
    if (iVar3 != 0) {
      uVar6 = std::__throw_system_error(iVar3);
      if (local_138[0]._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      pthread_mutex_unlock(local_160);
      _Unwind_Resume(uVar6);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
    std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_140);
    local_164 = arg_index;
    local_148 = enqueueCounter;
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,local_138,&local_190);
    paVar1 = &local_138[0].field_2;
    local_170 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_190);
    local_150 = size;
    lVar4 = std::__cxx11::string::find((char *)&local_190,0x19e01b,0);
    lVar4 = std::__cxx11::string::find((char *)&local_190,0x19e01b,lVar4 + 1);
    if (lVar4 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_138,(ulong)&local_190);
        mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_138[0]._M_dataplus._M_p);
        }
        lVar4 = std::__cxx11::string::find((char *)&local_190,0x19e01b,lVar4 + 1);
      } while (lVar4 != -1);
    }
    snprintf((char *)local_138,0x100,"%04u",local_148);
    std::__cxx11::string::append((char *)&local_190);
    std::__cxx11::string::append((char *)&local_190);
    std::__cxx11::string::append((char *)&local_190);
    size_00 = local_150;
    local_140 = kernel;
    __k = std::
          map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
          ::operator[](&local_170->m_KernelInfoMap,&local_140);
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(local_170->m_LongKernelNameMap)._M_h,&__k->KernelName);
    pmVar7 = (mapped_type *)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur + 0x28);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pmVar7 = __k;
    }
    pcVar2 = (pmVar7->KernelName)._M_dataplus._M_p;
    local_138[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar2,pcVar2 + (pmVar7->KernelName)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_138[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
    snprintf((char *)local_138,0x100,"%d",(ulong)local_164);
    std::__cxx11::string::append((char *)&local_190);
    std::__cxx11::string::append((char *)&local_190);
    std::__cxx11::string::append((char *)&local_190);
    if (local_158 != (void *)0x0) {
      dumpMemoryToFile(local_170,&local_190,false,local_158,size_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_160);
  }
  return;
}

Assistant:

void CLIntercept::dumpArgument(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_int arg_index,
    size_t size,
    const void *pBuffer )
{
    if( kernel )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/SetKernelArg/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );
            fileName += "SetKernelArg_";
            fileName += enqueueCount;
        }

        // Add the kernel name to the file name
        {
            fileName += "_Kernel_";
            fileName += getShortKernelName(kernel);
        }

        // Add the arg number to the file name
        {
            char    argName[ MAX_PATH ];

            CLI_SPRINTF( argName, MAX_PATH, "%d", arg_index );

            fileName += "_Arg_";
            fileName += argName;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        if( pBuffer != NULL)
        {
            dumpMemoryToFile(
                fileName,
                false,
                pBuffer,
                size );
        }
    }
}